

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O1

TopicManagerPtr __thiscall miniros::Publisher::getTopicManager(Publisher *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  TopicManagerPtr *pTVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long *in_RSI;
  TopicManagerPtr TVar3;
  
  if (*in_RSI == 0) {
    (this->impl_).super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->impl_).super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else if (*(long *)(*in_RSI + 0x60) == 0) {
    pTVar2 = TopicManager::instance();
    (this->impl_).super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (pTVar2->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var1 = (pTVar2->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (this->impl_).super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var1;
    in_RDX._M_pi = extraout_RDX;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
  }
  else {
    TVar3 = NodeHandle::getTopicManager((NodeHandle *)this);
    in_RDX = TVar3.super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
  }
  TVar3.super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  TVar3.super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TopicManagerPtr)
         TVar3.super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TopicManagerPtr Publisher::getTopicManager() const {
  if (!impl_)
    return nullptr;
  return impl_->node_handle_? impl_->node_handle_->getTopicManager() : TopicManager::instance();
}